

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O3

vorbis_info_floor * floor1_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  int **ppiVar1;
  void *pvVar2;
  uint uVar3;
  uint *__ptr;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  vorbis_info_floor1 *info;
  long lVar13;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int *sortpointer [65];
  int *local_238 [65];
  
  pvVar2 = vi->codec_setup;
  __ptr = (uint *)calloc(1,0x460);
  lVar4 = oggpack_read(opb,5);
  uVar7 = (uint)lVar4;
  *__ptr = uVar7;
  if (0 < (int)uVar7) {
    uVar11 = 0xffffffff;
    uVar15 = 0;
    do {
      lVar4 = oggpack_read(opb,4);
      uVar3 = (uint)lVar4;
      __ptr[uVar15 + 1] = uVar3;
      if ((int)uVar3 < 0) goto LAB_001e067c;
      if ((int)uVar11 <= (int)uVar3) {
        uVar11 = uVar3;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (uVar7 & 0x7fffffff));
    puVar9 = __ptr + 0x50;
    uVar15 = 0;
    do {
      lVar4 = oggpack_read(opb,3);
      __ptr[uVar15 + 0x20] = (int)lVar4 + 1;
      lVar4 = oggpack_read(opb,2);
      uVar7 = (uint)lVar4;
      __ptr[uVar15 + 0x30] = uVar7;
      if ((int)uVar7 < 0) goto LAB_001e067c;
      if (uVar7 == 0) {
        uVar3 = __ptr[uVar15 + 0x40];
      }
      else {
        lVar4 = oggpack_read(opb,8);
        uVar3 = (uint)lVar4;
        __ptr[uVar15 + 0x40] = uVar3;
      }
      if (((int)uVar3 < 0) || (*(int *)((long)pvVar2 + 0x20) <= (int)uVar3)) goto LAB_001e067c;
      if (uVar7 != 0x1f) {
        lVar4 = 0;
        do {
          lVar5 = oggpack_read(opb,8);
          uVar7 = (uint)lVar5 - 1;
          puVar9[lVar4] = uVar7;
          if ((0x80000000 < (uint)lVar5) || (*(int *)((long)pvVar2 + 0x20) <= (int)uVar7))
          goto LAB_001e067c;
          lVar4 = lVar4 + 1;
        } while (lVar4 < 1 << ((byte)__ptr[uVar15 + 0x30] & 0x1f));
      }
      uVar15 = uVar15 + 1;
      puVar9 = puVar9 + 8;
    } while (uVar15 != uVar11 + 1);
  }
  lVar4 = oggpack_read(opb,2);
  __ptr[0xd0] = (int)lVar4 + 1;
  lVar4 = oggpack_read(opb,4);
  if ((int)lVar4 < 0) {
LAB_001e067c:
    free(__ptr);
    __ptr = (uint *)0x0;
  }
  else {
    uVar7 = *__ptr;
    if ((int)uVar7 < 1) {
      __ptr[0xd1] = 0;
      __ptr[0xd2] = 1 << ((byte)lVar4 & 0x1f);
      iVar14 = 0;
      uVar7 = 2;
    }
    else {
      uVar11 = 1 << ((byte)lVar4 & 0x1f);
      lVar5 = 0;
      iVar8 = 0;
      iVar12 = 0;
      do {
        uVar3 = __ptr[(long)(int)__ptr[lVar5 + 1] + 0x20];
        iVar14 = uVar3 + iVar12;
        if (0x3f < iVar14) goto LAB_001e067c;
        if (iVar8 < iVar14) {
          lVar13 = 0;
          do {
            lVar6 = oggpack_read(opb,(int)lVar4);
            uVar7 = (uint)lVar6;
            __ptr[(long)iVar8 + lVar13 + 0xd3] = uVar7;
            if (((int)uVar7 < 0) || ((int)uVar11 <= (int)uVar7)) goto LAB_001e067c;
            lVar13 = lVar13 + 1;
          } while ((uVar3 + iVar12) - iVar8 != (int)lVar13);
          uVar7 = *__ptr;
          iVar8 = iVar14;
        }
        lVar5 = lVar5 + 1;
        iVar12 = iVar14;
      } while (lVar5 < (int)uVar7);
      __ptr[0xd1] = 0;
      __ptr[0xd2] = uVar11;
      uVar7 = iVar14 + 2;
      if (iVar14 < -1) {
        qsort(local_238,(long)(int)uVar7,8,icomp);
        return __ptr;
      }
    }
    uVar15 = 1;
    if (1 < (int)uVar7) {
      uVar15 = (ulong)uVar7;
    }
    lVar4 = uVar15 - 1;
    auVar16._8_4_ = (int)lVar4;
    auVar16._0_8_ = lVar4;
    auVar16._12_4_ = (int)((ulong)lVar4 >> 0x20);
    puVar9 = __ptr + 0xd2;
    lVar4 = 0;
    auVar16 = auVar16 ^ _DAT_001e8190;
    auVar17 = _DAT_001e8180;
    do {
      auVar18 = auVar17 ^ _DAT_001e8190;
      if ((bool)(~(auVar18._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar18._0_4_ ||
                  auVar16._4_4_ < auVar18._4_4_) & 1)) {
        *(uint **)((long)local_238 + lVar4) = puVar9 + -1;
      }
      if ((auVar18._12_4_ != auVar16._12_4_ || auVar18._8_4_ <= auVar16._8_4_) &&
          auVar18._12_4_ <= auVar16._12_4_) {
        *(uint **)((long)local_238 + lVar4 + 8) = puVar9;
      }
      lVar5 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar5 + 2;
      lVar4 = lVar4 + 0x10;
      puVar9 = puVar9 + 2;
    } while ((ulong)((int)uVar15 + 1U & 0xfffffffe) << 3 != lVar4);
    qsort(local_238,(long)(int)uVar7,8,icomp);
    if (-1 < iVar14) {
      uVar15 = 2;
      if (2 < (int)uVar7) {
        uVar15 = (ulong)uVar7;
      }
      uVar10 = 1;
      iVar14 = *local_238[0];
      do {
        ppiVar1 = local_238 + uVar10;
        if (iVar14 == **ppiVar1) goto LAB_001e067c;
        uVar10 = uVar10 + 1;
        iVar14 = **ppiVar1;
      } while (uVar15 != uVar10);
    }
  }
  return __ptr;
}

Assistant:

static vorbis_info_floor *floor1_unpack (vorbis_info *vi,oggpack_buffer *opb){
  codec_setup_info     *ci=vi->codec_setup;
  int j,k,count=0,maxclass=-1,rangebits;

  vorbis_info_floor1 *info=_ogg_calloc(1,sizeof(*info));
  /* read partitions */
  info->partitions=oggpack_read(opb,5); /* only 0 to 31 legal */
  for(j=0;j<info->partitions;j++){
    info->partitionclass[j]=oggpack_read(opb,4); /* only 0 to 15 legal */
    if(info->partitionclass[j]<0)goto err_out;
    if(maxclass<info->partitionclass[j])maxclass=info->partitionclass[j];
  }

  /* read partition classes */
  for(j=0;j<maxclass+1;j++){
    info->class_dim[j]=oggpack_read(opb,3)+1; /* 1 to 8 */
    info->class_subs[j]=oggpack_read(opb,2); /* 0,1,2,3 bits */
    if(info->class_subs[j]<0)
      goto err_out;
    if(info->class_subs[j])info->class_book[j]=oggpack_read(opb,8);
    if(info->class_book[j]<0 || info->class_book[j]>=ci->books)
      goto err_out;
    for(k=0;k<(1<<info->class_subs[j]);k++){
      info->class_subbook[j][k]=oggpack_read(opb,8)-1;
      if(info->class_subbook[j][k]<-1 || info->class_subbook[j][k]>=ci->books)
        goto err_out;
    }
  }

  /* read the post list */
  info->mult=oggpack_read(opb,2)+1;     /* only 1,2,3,4 legal now */
  rangebits=oggpack_read(opb,4);
  if(rangebits<0)goto err_out;

  for(j=0,k=0;j<info->partitions;j++){
    count+=info->class_dim[info->partitionclass[j]];
    if(count>VIF_POSIT) goto err_out;
    for(;k<count;k++){
      int t=info->postlist[k+2]=oggpack_read(opb,rangebits);
      if(t<0 || t>=(1<<rangebits))
        goto err_out;
    }
  }
  info->postlist[0]=0;
  info->postlist[1]=1<<rangebits;

  /* don't allow repeated values in post list as they'd result in
     zero-length segments */
  {
    int *sortpointer[VIF_POSIT+2];
    for(j=0;j<count+2;j++)sortpointer[j]=info->postlist+j;
    qsort(sortpointer,count+2,sizeof(*sortpointer),icomp);

    for(j=1;j<count+2;j++)
      if(*sortpointer[j-1]==*sortpointer[j])goto err_out;
  }

  return(info);

 err_out:
  floor1_free_info(info);
  return(NULL);
}